

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void biffopen(bifcxdef *ctx,int argc)

{
  char cVar1;
  ushort uVar2;
  runsdef *prVar3;
  ushort *puVar4;
  appctxdef *paVar5;
  int iVar6;
  int iVar7;
  FILE *pFVar8;
  errcxdef *peVar9;
  byte bVar10;
  char *__modes;
  runcxdef *ctx_00;
  ulong uVar11;
  long num;
  biffildef *pbVar12;
  bool bVar13;
  char fname [4096];
  char newname [4096];
  
  prVar3 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar3 + -1;
  if (prVar3[-1].runstyp != '\x03') {
    peVar9 = ctx->bifcxrun->runcxerr;
LAB_00210d8b:
    peVar9->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3ef);
  }
  bifcstr(ctx,fname,0x1000,(ctx->bifcxrun->runcxsp->runsv).runsvstr);
  iVar6 = os_is_file_absolute(fname);
  if (iVar6 == 0) {
    os_build_full_path(newname,0x1000,ctx->bifcxrun->runcxgamepath,fname);
    strcpy(fname,newname);
  }
  prVar3 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar3 + -1;
  ctx_00 = ctx->bifcxrun;
  if (prVar3[-1].runstyp != '\x03') {
    peVar9 = ctx_00->runcxerr;
    goto LAB_00210d8b;
  }
  puVar4 = (ushort *)(ctx_00->runcxsp->runsv).runsvstr;
  uVar2 = *puVar4;
  if (uVar2 < 3) {
LAB_00210d4f:
    ctx->bifcxrun->runcxerr->errcxptr->erraav[0].errastr = "fopen";
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
    runsign(ctx->bifcxrun,0x400);
  }
  pbVar12 = ctx->bifcxfile;
  num = 0;
LAB_00210b69:
  if (num == 10) {
LAB_00210d38:
    runpnil(ctx_00);
    return;
  }
  if (pbVar12->fp != (osfildef *)0x0) {
    num = num + 1;
    pbVar12 = pbVar12 + 1;
    goto LAB_00210b69;
  }
  cVar1 = (char)puVar4[1];
  if (cVar1 == 'R') {
LAB_00210ba1:
    iVar6 = 0x72;
  }
  else {
    iVar6 = 0x77;
    if ((cVar1 != 'W') && (cVar1 != 'w')) {
      if (cVar1 == 'r') goto LAB_00210ba1;
      goto LAB_00210d4f;
    }
  }
  if (uVar2 == 3) {
    bVar13 = true;
LAB_00210c11:
    uVar11 = 0;
  }
  else {
    bVar13 = *(char *)((long)puVar4 + 3) != '+';
    iVar7 = (uint)uVar2 + (uint)bVar13 + -4;
    if (iVar7 < 1) goto LAB_00210c11;
    bVar10 = *(char *)((long)puVar4 + (4 - (ulong)(*(char *)((long)puVar4 + 3) != '+'))) + 0xbe;
    if (((0x32 < bVar10) || ((0x4000100040001U >> ((ulong)bVar10 & 0x3f) & 1) == 0)) ||
       (uVar11 = 0x4000000040000 >> (bVar10 & 0x3f), iVar7 != 1)) goto LAB_00210d4f;
  }
  paVar5 = ctx->bifcxappctx;
  if ((paVar5 != (appctxdef *)0x0) &&
     (paVar5->get_io_safety_level != (_func_void_void_ptr_int_ptr_int_ptr *)0x0)) {
    (*paVar5->get_io_safety_level)
              (paVar5->io_safety_level_ctx,&ctx->bifcxsafetyr,&ctx->bifcxsafetyw);
    ctx_00 = ctx->bifcxrun;
  }
  iVar7 = os_is_file_in_dir(fname,ctx_00->runcxgamepath,1,0);
  if (iVar6 == 0x72) {
    if ((3 < ctx->bifcxsafetyr) || (1 < ctx->bifcxsafetyr && iVar7 == 0)) goto LAB_00210d34;
    if ((uVar11 & 1) != 0) {
      if (!bVar13) goto LAB_00210d4f;
      __modes = "r";
      goto LAB_00210d08;
    }
    if (bVar13) {
      __modes = "rb";
      goto LAB_00210d08;
    }
    pFVar8 = (FILE *)osfoprwb(fname,4);
  }
  else {
    if (iVar6 != 0x77) goto LAB_00210d4f;
    if ((2 < ctx->bifcxsafetyw) || (0 < ctx->bifcxsafetyw && iVar7 == 0)) goto LAB_00210d34;
    if ((uVar11 & 1) != 0) {
      if (bVar13) {
        __modes = "w";
        goto LAB_00210d08;
      }
      goto LAB_00210d4f;
    }
    if (bVar13) {
      __modes = "wb";
    }
    else {
      __modes = "w+b";
    }
LAB_00210d08:
    pFVar8 = fopen(fname,__modes);
  }
  if (pFVar8 != (FILE *)0x0) {
    pbVar12->flags = (byte)~(byte)uVar11 & 1;
    pbVar12->fp = (osfildef *)pFVar8;
    runpnum(ctx->bifcxrun,num);
    return;
  }
LAB_00210d34:
  ctx_00 = ctx->bifcxrun;
  goto LAB_00210d38;
}

Assistant:

void biffopen(bifcxdef *ctx, int argc)
{
    char      fname[OSFNMAX];
    uchar    *p;
    uchar    *mode;
    int       modelen;
    int       fnum;
    osfildef *fp;
    int       bin_mode = TRUE;   /* flag: mode is binary (rather than text) */
    int       rw_mode = FALSE;     /* flag: both read and write are allowed */
    char      main_mode;                     /* 'r' for read, 'w' for write */
    int       in_same_dir;            /* flag: file is in current directory */
    appctxdef *appctx;
    
    bifcntargs(ctx, 2, argc);

    /* get the filename */
    p = runpopstr(ctx->bifcxrun);
    bifcstr(ctx, fname, (size_t)sizeof(fname), p);

    /* 
     *   If it's a relative path, combine it with the game file path to form
     *   the absolute path.  This ensures that relative paths are always
     *   relative to the original working directory if the OS-level working
     *   directory has changed. 
     */
    if (!os_is_file_absolute(fname))
    {
        /* combine the game file path with the relative filename */
        char newname[OSFNMAX];
        os_build_full_path(newname, sizeof(newname),
                           ctx->bifcxrun->runcxgamepath, fname);

        /* replace the original filename with the full path */
        strcpy(fname, newname);
    }

    /* get the mode string */
    mode = runpopstr(ctx->bifcxrun);
    modelen = osrp2(mode) - 2;
    mode += 2;
    if (modelen < 1)
        goto bad_mode;

    /* allocate a filenum for the file */
    for (fnum = 0 ; fnum < BIFFILMAX ; ++fnum)
    {
        if (ctx->bifcxfile[fnum].fp == 0)
            break;
    }
    if (fnum == BIFFILMAX)
    {
        /* return nil to indicate failure */
        runpnil(ctx->bifcxrun);
        return;
    }

    /* parse the main mode */
    switch(*mode)
    {
    case 'w':
    case 'W':
        main_mode = 'w';
        break;

    case 'r':
    case 'R':
        main_mode = 'r';
        break;

    default:
        goto bad_mode;
    }

    /* skip the main mode, and check for a '+' flag */
    ++mode;
    --modelen;
    if (modelen > 0 && *mode == '+')
    {
        /* note the read/write mode */
        rw_mode = TRUE;

        /* skip the speciifer */
        ++mode;
        --modelen;
    }

    /* check for a binary/text specifier */
    if (modelen > 0)
    {
        switch(*mode)
        {
        case 'b':
        case 'B':
            bin_mode = TRUE;
            break;

        case 't':
        case 'T':
            bin_mode = FALSE;
            break;

        default:
            goto bad_mode;
        }

        /* skip the binary/text specifier */
        ++mode;
        --modelen;
    }

    /* it's an error if there's anything left unparsed */
    if (modelen > 0)
        goto bad_mode;

    /*
     *   If we have a host application context, and it provides a file
     *   safety level callback function, ask the host system for its
     *   current file safety level, which overrides our current setting.  
     */
    appctx = ctx->bifcxappctx;
    if (appctx != 0 && appctx->get_io_safety_level != 0)
    {
        /* 
         *   ask the host system for the current level, and override any
         *   setting we previously had 
         */
        (*appctx->get_io_safety_level)(
            appctx->io_safety_level_ctx,
            &ctx->bifcxsafetyr, &ctx->bifcxsafetyw);
    }

    /* 
     *   Check to see if the file is in the current working directory - if
     *   not, we may have to disallow the operation based on safety level
     *   settings.
     */
    in_same_dir = os_is_file_in_dir(
        fname, ctx->bifcxrun->runcxgamepath, TRUE, FALSE);

    /* check file safety settings */
    switch(main_mode)
    {
    case 'w':
        /* 
         *   writing - we must be at a safety level no higher than 2
         *   (read/write current directory) to write at all, and we must be
         *   level 0 to write a file that's not in the current directory 
         */
        if (ctx->bifcxsafetyw > 2
            || (!in_same_dir && ctx->bifcxsafetyw > 0))
        {
            /* this operation is not allowed - return failure */
            runpnil(ctx->bifcxrun);
            return;
        }
        break;

    case 'r':
        /*
         *   reading - we must be at a safety level no higher than 3 (read
         *   current directory) to read at all, and we must be at safety
         *   level 1 (read any directory) or lower to read a file that's not
         *   in the current directory 
         */
        if (ctx->bifcxsafetyr > 3
            || (!in_same_dir && ctx->bifcxsafetyr > 1))
        {
            /* this operation is not allowed - return failure */
            runpnil(ctx->bifcxrun);
            return;
        }
        break;

    default:
        /* 
         *   fail the operation, as a code maintenance measure to make
         *   sure that we add appropriate cases to this switch (even if
         *   merely to allow the operation unconditionally) in the event
         *   that more modes are added in the future 
         */
        goto bad_mode;
    }

    /* try opening the file */
    switch(main_mode)
    {
    case 'w':
        /* check for binary vs text mode */
        if (bin_mode)
        {
            /* 
             *   binary mode -- allow read/write or just writing, but in
             *   either case truncate the file if it already exists, and
             *   create a new file if it doesn't exist 
             */
            if (rw_mode)
                fp = osfoprwtb(fname, OSFTDATA);
            else
                fp = osfopwb(fname, OSFTDATA);
        }
        else
        {
            /* text mode - don't allow read/write on a text file */
            if (rw_mode)
                goto bad_mode;

            /* open the file */
            fp = osfopwt(fname, OSFTTEXT);
        }
        break;

    case 'r':
        /* check for binary vs text mode */
        if (bin_mode)
        {
            /*
             *   Binary mode -- allow read/write or just reading; leave
             *   any existing file intact.
             */
            if (rw_mode)
            {
                /* open for reading and writing, keeping existing data */
                fp = osfoprwb(fname, OSFTDATA);
            }
            else
            {
                /* open for read-only */
                fp = osfoprb(fname, OSFTDATA);
            }
        }
        else
        {
            /* text mode -- only allow reading */
            if (rw_mode)
                goto bad_mode;

            /* open the file */
            fp = osfoprt(fname, OSFTTEXT);
        }
        break;

    default:
        goto bad_mode;
    }

    /* if we couldn't open it, return nil */
    if (fp == 0)
    {
        runpnil(ctx->bifcxrun);
        return;
    }

    /* store the flags */
    ctx->bifcxfile[fnum].flags = 0;
    if (bin_mode)
        ctx->bifcxfile[fnum].flags |= BIFFIL_F_BINARY;

    /* remember the file handle */
    ctx->bifcxfile[fnum].fp = fp;

    /* return the file number (i.e., the slot number) */
    runpnum(ctx->bifcxrun, (long)fnum);
    return;


    /* come here on a mode error */
bad_mode:
    runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "fopen");
}